

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.hpp
# Opt level: O0

void __thiscall OpenMD::Mie::~Mie(Mie *this)

{
  Mie *in_RDI;
  
  ~Mie(in_RDI);
  operator_delete(in_RDI,200);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }